

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbuffer.c
# Opt level: O0

void bounded_buffer_cleanup(bounded_buffer_t *bb)

{
  int local_18;
  uint local_14;
  int i;
  int unfreed_count;
  bounded_buffer_t *bb_local;
  
  local_14 = 0;
  for (local_18 = 0; local_18 < bb->size; local_18 = local_18 + 1) {
    if (bb->entries[local_18] != (entry_t *)0x0) {
      local_14 = local_14 + 1;
    }
  }
  if (0 < (int)local_14) {
    fprintf(_stderr,
            "\x1b[0;32m[INFO]    %s (%s:%d) \x1b[0mWarning: %d entries in bounded buffer not freed\n\n"
            ,"bounded_buffer_cleanup",
            "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/bounded-buffer/bbuffer.c"
            ,0x3e,(ulong)local_14);
  }
  free(bb->entries);
  pthread_mutex_destroy((pthread_mutex_t *)&bb->lock);
  pthread_cond_destroy((pthread_cond_t *)&bb->has_space);
  pthread_cond_destroy((pthread_cond_t *)&bb->has_items);
  return;
}

Assistant:

void bounded_buffer_cleanup(bounded_buffer_t* bb)
{
    int unfreed_count = 0;
    for (int i=0; i < bb->size; i++)
        if (bb->entries[i] != NULL)
            unfreed_count++;
    if (unfreed_count > 0)
    {
        lwlog_info("Warning: %d entries in bounded buffer not freed\n", unfreed_count);
    }
    free(bb->entries);
    pthread_mutex_destroy(&bb->lock);
    pthread_cond_destroy(&bb->has_space);
    pthread_cond_destroy(&bb->has_items);
}